

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

error<idx2::idx2_err_code> __thiscall
idx2::ComputeFileDirDepths::anon_class_8_1_897e6233::operator()(anon_class_8_1_897e6233 *this)

{
  error<idx2::idx2_err_code> eVar1;
  int iVar2;
  long *in_FS_OFFSET;
  stref sVar3;
  int L;
  stref ErrStr;
  anon_class_8_1_897e6233 *this_local;
  error<idx2::idx2_err_code> Err;
  
  error<idx2::idx2_err_code>::error
            ((error<idx2::idx2_err_code> *)&this_local,TooManyFilesPerDir,true,"%d");
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x276;
  sVar3 = ToString((idx2_err_code)Err.Msg);
  iVar2 = snprintf((char *)(*in_FS_OFFSET + -0xf80),0x400,"%.*s (file %s, line %d): ",
                   (ulong)(uint)sVar3.Size,sVar3.field_0.Ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                   ,0x276);
  snprintf((char *)(*in_FS_OFFSET + -0xf80 + (long)iVar2),0x400 - (long)iVar2,"%d",
           (ulong)(uint)(*this->Idx2)->FilesPerDir);
  eVar1.Code = (idx2_err_code)Err.Msg;
  eVar1.Msg = (cstr)this_local;
  eVar1.StackIdx = Err.Msg._1_1_;
  eVar1.StrGened = (bool)Err.Msg._2_1_;
  eVar1._11_5_ = Err.Msg._3_5_;
  return eVar1;
}

Assistant:

idx2_For (int, I, 0, Idx2->NLevels)
  {
    Idx2->BricksPerFile[I] = Idx2->BricksPerChunk[I] * Idx2->ChunksPerFile[I];
    Idx2->FilesDirsDepth[I].Len = 0;
    i8 DepthAccum = Idx2->FilesDirsDepth[I][Idx2->FilesDirsDepth[I].Len++] =
      Log2Ceil(Idx2->BricksPerFile[I]);
    i8 Len = Idx2->BricksOrderStr[I].Len /* - Idx2->TformOrderFull.Len*/;
    while (DepthAccum < Len)
    {
      i8 Inc = Min(i8(Len - DepthAccum), Log2Ceil(Idx2->FilesPerDir));
      DepthAccum += (Idx2->FilesDirsDepth[I][Idx2->FilesDirsDepth[I].Len++] = Inc);
    }
    if (Idx2->FilesDirsDepth[I].Len > idx2_file::MaxSpatialDepth)
      return idx2_Error(idx2_err_code::TooManyFilesPerDir);
    Reverse(Begin(Idx2->FilesDirsDepth[I]),
            Begin(Idx2->FilesDirsDepth[I]) + Idx2->FilesDirsDepth[I].Len);
  }